

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_kepler.c
# Opt level: O0

void InitialConditions(N_Vector y0vec,sunrealtype ecc)

{
  double *pdVar1;
  undefined8 in_RDI;
  double in_XMM0_Qa;
  sunrealtype *y0;
  sunrealtype one;
  sunrealtype zero;
  double local_30;
  
  pdVar1 = (double *)N_VGetArrayPointer(in_RDI);
  *pdVar1 = 1.0 - in_XMM0_Qa;
  pdVar1[1] = 0.0;
  pdVar1[2] = 0.0;
  if (0.0 < (in_XMM0_Qa + 1.0) / (1.0 - in_XMM0_Qa)) {
    local_30 = sqrt((in_XMM0_Qa + 1.0) / (1.0 - in_XMM0_Qa));
  }
  else {
    local_30 = 0.0;
  }
  pdVar1[3] = local_30;
  return;
}

Assistant:

void InitialConditions(N_Vector y0vec, sunrealtype ecc)
{
  const sunrealtype zero = SUN_RCONST(0.0);
  const sunrealtype one  = SUN_RCONST(1.0);
  sunrealtype* y0        = N_VGetArrayPointer(y0vec);

  y0[0] = one - ecc;
  y0[1] = zero;
  y0[2] = zero;
  y0[3] = SUNRsqrt((one + ecc) / (one - ecc));
}